

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O1

tm * anon_unknown.dwarf_318d2e::matchYearMonth(tm *__return_storage_ptr__,tm when,tm *base)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint month;
  
  iVar2 = base->tm_year;
  if (iVar2 < when.tm_year) {
    when.tm_mon = when.tm_year * 0xc + when.tm_mon + iVar2 * -0xc;
    when.tm_year = iVar2;
  }
  if (when.tm_year < iVar2) {
    when.tm_mon = when.tm_year * 0xc + when.tm_mon + iVar2 * -0xc;
    when.tm_year = iVar2;
  }
  if (base->tm_mon < when.tm_mon) {
    do {
      if (when.tm_mon < 0) {
        uVar1 = (int)(when.tm_mon + 1U) / 0xc - 1;
        uVar3 = (int)(when.tm_mon + 1U) % 0xc + 0xb;
      }
      else {
        uVar1 = (uint)when.tm_mon / 0xc;
        uVar3 = (uint)when.tm_mon % 0xc;
      }
      month = uVar3;
      if (uVar3 == 0) {
        month = 0xc;
      }
      iVar2 = (uVar1 + when.tm_year) - (uint)(uVar3 == 0);
      iVar2 = QGregorianCalendar::monthLength(month,(iVar2 - (uint)(iVar2 < -0x76b)) + 0x76c);
      when.tm_mday = when.tm_mday + iVar2;
      when.tm_mon = when.tm_mon - 1;
    } while (base->tm_mon < when.tm_mon);
  }
  if (when.tm_mon < base->tm_mon) {
    do {
      if (when.tm_mon < 0) {
        uVar1 = (int)(when.tm_mon + 1U) / 0xc - 1;
        uVar3 = (int)(when.tm_mon + 1U) % 0xc + 0xb;
      }
      else {
        uVar1 = (uint)when.tm_mon / 0xc;
        uVar3 = (uint)when.tm_mon % 0xc;
      }
      iVar2 = QGregorianCalendar::monthLength
                        (uVar3 + 1,
                         ((uVar1 + when.tm_year) - (uint)((int)(uVar1 + when.tm_year) < -0x76b)) +
                         0x76c);
      when.tm_mday = when.tm_mday - iVar2;
      when.tm_mon = when.tm_mon + 1;
    } while (when.tm_mon < base->tm_mon);
  }
  __return_storage_ptr__->tm_zone = when.tm_zone;
  __return_storage_ptr__->tm_isdst = when.tm_isdst;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = when._36_4_;
  __return_storage_ptr__->tm_gmtoff = when.tm_gmtoff;
  __return_storage_ptr__->tm_mon = when.tm_mon;
  __return_storage_ptr__->tm_year = when.tm_year;
  __return_storage_ptr__->tm_wday = when.tm_wday;
  __return_storage_ptr__->tm_yday = when.tm_yday;
  __return_storage_ptr__->tm_sec = when.tm_sec;
  __return_storage_ptr__->tm_min = when.tm_min;
  __return_storage_ptr__->tm_hour = when.tm_hour;
  __return_storage_ptr__->tm_mday = when.tm_mday;
  return __return_storage_ptr__;
}

Assistant:

Q_DECL_COLD_FUNCTION
struct tm matchYearMonth(struct tm when, const struct tm &base)
{
    // Adjust *when to be a denormal representation of the same point in time
    // but with tm_year and tm_mon the same as base. In practice this will
    // represent an adjacent month, so don't worry too much about optimising for
    // any other case; we almost certainly run zero or one iteration of one of
    // the year loops then zero or one iteration of one of the month loops.
    while (when.tm_year > base.tm_year) {
        --when.tm_year;
        when.tm_mon += 12;
    }
    while (when.tm_year < base.tm_year) {
        ++when.tm_year;
        when.tm_mon -= 12;
    }
    Q_ASSERT(when.tm_year == base.tm_year);
    while (when.tm_mon > base.tm_mon) {
        const auto yearMon = QRoundingDown::qDivMod<12>(when.tm_mon);
        int year = yearMon.quotient;
        // We want the month before's Qt month number, which is the tm_mon mod 12:
        int month = yearMon.remainder;
        if (month == 0) {
            --year;
            month = 12;
        }
        year += when.tm_year;
        when.tm_mday += QGregorianCalendar::monthLength(month, qYearFromTmYear(year));
        --when.tm_mon;
    }
    while (when.tm_mon < base.tm_mon) {
        const auto yearMon = QRoundingDown::qDivMod<12>(when.tm_mon);
        // Qt month number is offset from tm_mon by one:
        when.tm_mday -= QGregorianCalendar::monthLength(
            yearMon.remainder + 1, qYearFromTmYear(yearMon.quotient + when.tm_year));
        ++when.tm_mon;
    }
    Q_ASSERT(when.tm_mon == base.tm_mon);
    return when;
}